

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuInterval.cpp
# Opt level: O1

Interval *
tcu::applyMonotone(Interval *__return_storage_ptr__,DoubleFunc2 *func,Interval *arg0,Interval *arg1)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  deRoundingMode dVar4;
  ulong uVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  
  __return_storage_ptr__->m_hasNaN = false;
  __return_storage_ptr__->m_lo = INFINITY;
  __return_storage_ptr__->m_hi = -INFINITY;
  dVar15 = arg0->m_lo;
  if (dVar15 < arg0->m_hi || dVar15 == arg0->m_hi) {
    dVar13 = arg1->m_lo;
    if (dVar13 < arg1->m_hi || dVar13 == arg1->m_hi) {
      dVar4 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar6 = (*func)(dVar15,dVar13);
      dVar16 = dVar6;
      if (NAN(dVar6)) {
        dVar16 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar17 = (*func)(dVar15,dVar13);
      dVar13 = dVar17;
      if (NAN(dVar17)) {
        dVar13 = INFINITY;
      }
      deSetRoundingMode(dVar4);
      dVar9 = arg1->m_hi;
      dVar4 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar7 = (*func)(dVar15,dVar9);
      dVar10 = dVar7;
      if (NAN(dVar7)) {
        dVar10 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar8 = (*func)(dVar15,dVar9);
      deSetRoundingMode(dVar4);
      dVar9 = (double)(~-(ulong)NAN(dVar6) & (ulong)dVar6 | -(ulong)NAN(dVar6) & 0xfff0000000000000)
      ;
      dVar15 = (double)(~-(ulong)NAN(dVar17) & (ulong)dVar17 |
                       -(ulong)NAN(dVar17) & 0xfff0000000000000);
      uVar5 = -(ulong)(dVar15 <= dVar9);
      dVar11 = (double)(-(ulong)(dVar16 <= dVar13) & (ulong)dVar16 |
                       ~-(ulong)(dVar16 <= dVar13) & (ulong)dVar13);
      dVar13 = (double)(uVar5 & (ulong)dVar9 | ~uVar5 & (ulong)dVar15);
      dVar15 = (double)(~-(ulong)NAN(dVar7) & (ulong)dVar7 | -(ulong)NAN(dVar7) & 0xfff0000000000000
                       );
      dVar16 = dVar8;
      if (NAN(dVar8)) {
        dVar16 = -INFINITY;
      }
      uVar5 = -(ulong)(dVar16 <= dVar15);
      dVar16 = (double)(uVar5 & (ulong)dVar15 | ~uVar5 & (ulong)dVar16);
      dVar15 = (double)(~-(ulong)NAN(dVar8) & (ulong)dVar8 | -(ulong)NAN(dVar8) & 0x7ff0000000000000
                       );
      uVar5 = -(ulong)(dVar10 <= dVar15);
      dVar15 = (double)(uVar5 & (ulong)dVar10 | ~uVar5 & (ulong)dVar15);
      bVar2 = (NAN(dVar6) || NAN(dVar17)) || (NAN(dVar7) || NAN(dVar8));
      uVar5 = -(ulong)(dVar11 <= dVar15);
      dVar6 = (double)(uVar5 & (ulong)dVar11 | ~uVar5 & (ulong)dVar15);
      uVar5 = -(ulong)(dVar16 <= dVar13);
      dVar15 = (double)(uVar5 & (ulong)dVar13 | ~uVar5 & (ulong)dVar16);
    }
    else {
      bVar2 = false;
      dVar6 = INFINITY;
      dVar15 = -INFINITY;
    }
    dVar17 = INFINITY;
    dVar16 = -INFINITY;
    bVar1 = arg1->m_hasNaN;
    dVar13 = arg1->m_lo;
    if (dVar13 < arg1->m_hi || dVar13 == arg1->m_hi) {
      dVar16 = arg0->m_hi;
      dVar4 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar9 = (*func)(dVar16,dVar13);
      dVar17 = dVar9;
      if (NAN(dVar9)) {
        dVar17 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar10 = (*func)(dVar16,dVar13);
      dVar13 = dVar10;
      if (NAN(dVar10)) {
        dVar13 = INFINITY;
      }
      deSetRoundingMode(dVar4);
      dVar7 = arg1->m_hi;
      dVar4 = deGetRoundingMode();
      deSetRoundingMode(DE_ROUNDINGMODE_TO_NEGATIVE_INF);
      dVar11 = (*func)(dVar16,dVar7);
      dVar8 = dVar11;
      if (NAN(dVar11)) {
        dVar8 = INFINITY;
      }
      deSetRoundingMode(DE_ROUNDINGMODE_TO_POSITIVE_INF);
      dVar12 = (*func)(dVar16,dVar7);
      deSetRoundingMode(dVar4);
      dVar7 = (double)(~-(ulong)NAN(dVar9) & (ulong)dVar9 | -(ulong)NAN(dVar9) & 0xfff0000000000000)
      ;
      dVar16 = (double)(~-(ulong)NAN(dVar10) & (ulong)dVar10 |
                       -(ulong)NAN(dVar10) & 0xfff0000000000000);
      uVar5 = -(ulong)(dVar16 <= dVar7);
      dVar14 = (double)(-(ulong)(dVar17 <= dVar13) & (ulong)dVar17 |
                       ~-(ulong)(dVar17 <= dVar13) & (ulong)dVar13);
      dVar16 = (double)(uVar5 & (ulong)dVar7 | ~uVar5 & (ulong)dVar16);
      dVar13 = (double)(~-(ulong)NAN(dVar11) & (ulong)dVar11 |
                       -(ulong)NAN(dVar11) & 0xfff0000000000000);
      dVar17 = dVar12;
      if (NAN(dVar12)) {
        dVar17 = -INFINITY;
      }
      uVar5 = -(ulong)(dVar17 <= dVar13);
      dVar7 = (double)(uVar5 & (ulong)dVar13 | ~uVar5 & (ulong)dVar17);
      dVar13 = (double)(~-(ulong)NAN(dVar12) & (ulong)dVar12 |
                       -(ulong)NAN(dVar12) & 0x7ff0000000000000);
      uVar5 = -(ulong)(dVar8 <= dVar13);
      dVar13 = (double)(uVar5 & (ulong)dVar8 | ~uVar5 & (ulong)dVar13);
      bVar3 = (bool)((-(NAN(dVar9) || NAN(dVar10)) | -(NAN(dVar11) || NAN(dVar12))) & 1);
      uVar5 = -(ulong)(dVar14 <= dVar13);
      dVar17 = (double)(uVar5 & (ulong)dVar14 | ~uVar5 & (ulong)dVar13);
      uVar5 = -(ulong)(dVar7 <= dVar16);
      dVar16 = (double)(uVar5 & (ulong)dVar16 | ~uVar5 & (ulong)dVar7);
    }
    else {
      bVar3 = false;
    }
    if ((arg1->m_hasNaN & 1U) != 0) {
      bVar3 = true;
    }
    if (bVar1 != false) {
      bVar3 = true;
    }
    if (bVar2) {
      bVar3 = true;
    }
    dVar13 = (double)(~-(ulong)(dVar6 <= dVar17) & (ulong)dVar17 |
                     (ulong)dVar6 & -(ulong)(dVar6 <= dVar17));
    dVar15 = (double)(~-(ulong)(dVar16 <= dVar15) & (ulong)dVar16 |
                     (ulong)dVar15 & -(ulong)(dVar16 <= dVar15));
  }
  else {
    dVar15 = -INFINITY;
    dVar13 = INFINITY;
    bVar3 = false;
  }
  __return_storage_ptr__->m_hasNaN = bVar3;
  __return_storage_ptr__->m_lo = dVar13;
  __return_storage_ptr__->m_hi = dVar15;
  if (arg0->m_hasNaN == true) {
    dVar15 = __return_storage_ptr__->m_lo;
    dVar13 = __return_storage_ptr__->m_hi;
    if (INFINITY <= dVar15) {
      dVar15 = INFINITY;
    }
    if (dVar13 <= -INFINITY) {
      dVar13 = -INFINITY;
    }
    __return_storage_ptr__->m_hasNaN = true;
    __return_storage_ptr__->m_lo = dVar15;
    __return_storage_ptr__->m_hi = dVar13;
  }
  return __return_storage_ptr__;
}

Assistant:

Interval applyMonotone (DoubleFunc2& func, const Interval& arg0, const Interval& arg1)
{
	Interval ret;

	TCU_INTERVAL_APPLY_MONOTONE2(ret, x, arg0, y, arg1, val,
								 TCU_SET_INTERVAL(val, point, point = func(x, y)));

	return ret;
}